

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

date_t duckdb::TimeBucket::WidthConvertibleToMonthsCommon
                 (int32_t bucket_width_months,int32_t ts_months,int32_t origin_months)

{
  int iVar1;
  int32_t year;
  date_t dVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = SubtractOperatorOverflowCheck::Operation<int,int,int>
                    (ts_months,origin_months % bucket_width_months);
  iVar4 = iVar1 - iVar1 % bucket_width_months;
  if (iVar1 % bucket_width_months != 0 && iVar1 < 0) {
    iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar4,bucket_width_months);
  }
  iVar4 = iVar4 + origin_months % bucket_width_months;
  iVar3 = iVar4 % 0xc;
  iVar1 = 1;
  if (iVar3 == 0 || -1 < iVar4) {
    year = iVar4 / 0xc + 0x7b2;
    if (-1 < iVar4) goto LAB_01cc056a;
  }
  else {
    year = 0x7b1 - (uint)-iVar4 / 0xc;
  }
  if (iVar3 != 0) {
    iVar1 = 0xd;
  }
LAB_01cc056a:
  dVar2 = Date::FromDate(year,iVar3 + iVar1,1);
  return (date_t)dVar2.days;
}

Assistant:

static inline date_t WidthConvertibleToMonthsCommon(int32_t bucket_width_months, int32_t ts_months,
	                                                    int32_t origin_months) {
		origin_months %= bucket_width_months;
		ts_months = SubtractOperatorOverflowCheck::Operation<int32_t, int32_t, int32_t>(ts_months, origin_months);

		int32_t result_months = (ts_months / bucket_width_months) * bucket_width_months;
		if (ts_months < 0 && ts_months % bucket_width_months != 0) {
			result_months =
			    SubtractOperatorOverflowCheck::Operation<int32_t, int32_t, int32_t>(result_months, bucket_width_months);
		}
		result_months += origin_months;

		int32_t year =
		    (result_months < 0 && result_months % 12 != 0) ? 1970 + result_months / 12 - 1 : 1970 + result_months / 12;
		int32_t month =
		    (result_months < 0 && result_months % 12 != 0) ? result_months % 12 + 13 : result_months % 12 + 1;

		return Date::FromDate(year, month, 1);
	}